

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kepler.h
# Opt level: O0

void PrintHelp(void)

{
  fprintf(_stderr,
          "ark_kepler: an ARKODE example demonstrating the SPRKStep time-stepping module solving the Kepler problem\n"
         );
  fprintf(_stderr,
          "  --step-mode <fixed, adapt>  should we use a fixed time-step or adaptive time-step (default fixed)\n"
         );
  fprintf(_stderr,
          "  --stepper <SPRK, ERK>       should we use SPRKStep or ARKStep with an ERK method (default SPRK)\n"
         );
  fprintf(_stderr,
          "  --method <string>           which method to use (default ARKODE_SPRK_MCLACHLAN_4_4)\n")
  ;
  fprintf(_stderr,
          "  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n"
         );
  fprintf(_stderr,"  --disable-tstop             turns off tstop mode\n");
  fprintf(_stderr,
          "  --dt <Real>                 the fixed-time step size to use if fixed time stepping is turned on (default 0.01)\n"
         );
  fprintf(_stderr,"  --tf <Real>                 the final time for the simulation (default 100)\n")
  ;
  fprintf(_stderr,"  --nout <int>                the number of output times (default 100)\n");
  fprintf(_stderr,
          "  --count-orbits              use rootfinding to count the number of completed orbits\n")
  ;
  fprintf(_stderr,
          "  --check-order               compute the order of the method used and check if it is within range of the expected\n"
         );
  return;
}

Assistant:

static void PrintHelp(void)
{
  fprintf(stderr, "ark_kepler: an ARKODE example demonstrating the SPRKStep "
                  "time-stepping module solving the Kepler problem\n");
  /* clang-format off */
  fprintf(stderr, "  --step-mode <fixed, adapt>  should we use a fixed time-step or adaptive time-step (default fixed)\n");
  fprintf(stderr, "  --stepper <SPRK, ERK>       should we use SPRKStep or ARKStep with an ERK method (default SPRK)\n");
  fprintf(stderr, "  --method <string>           which method to use (default ARKODE_SPRK_MCLACHLAN_4_4)\n");
  fprintf(stderr, "  --use-compensated-sums      turns on compensated summation in ARKODE where applicable\n");
  fprintf(stderr, "  --disable-tstop             turns off tstop mode\n");
  fprintf(stderr, "  --dt <Real>                 the fixed-time step size to use if fixed time stepping is turned on (default 0.01)\n");
  fprintf(stderr, "  --tf <Real>                 the final time for the simulation (default 100)\n");
  fprintf(stderr, "  --nout <int>                the number of output times (default 100)\n");
  fprintf(stderr, "  --count-orbits              use rootfinding to count the number of completed orbits\n");
  fprintf(stderr, "  --check-order               compute the order of the method used and check if it is within range of the expected\n");
  /* clang-format on */
}